

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  basic_format_specs<wchar_t> *pbVar5;
  uint uVar6;
  wchar_t wVar7;
  uint uVar8;
  ulong uVar9;
  _Alloc_hider _Var10;
  ulong uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  string groups;
  string local_f8;
  format_specs local_d8;
  ulong local_b8;
  ulong uStack_b0;
  wchar_t local_a8 [4];
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::num_writer>
  local_98;
  
  grouping_impl<wchar_t>(&local_f8,(locale_ref)(this->writer->locale_).locale_);
  if (local_f8._M_string_length == 0) {
    on_dec(this);
    goto LAB_0017d8fc;
  }
  wVar7 = thousands_sep_impl<wchar_t>((locale_ref)(this->writer->locale_).locale_);
  if (wVar7 == L'\0') {
    on_dec(this);
    goto LAB_0017d8fc;
  }
  uVar3 = (ulong)this->abs_value;
  uVar4 = *(ulong *)((long)&this->abs_value + 8);
  auVar13 = (undefined1  [16])this->abs_value;
  uVar12 = 1;
  if ((uVar3 < 10) <= uVar4) {
    uVar6 = 4;
    do {
      uVar12 = uVar6;
      uVar11 = auVar13._8_8_;
      uVar9 = auVar13._0_8_;
      if (uVar11 == 0 && (ulong)(99 < uVar9) <= -uVar11) {
        uVar12 = uVar12 - 2;
        goto LAB_0017d7da;
      }
      if (uVar11 == 0 && (ulong)(999 < uVar9) <= -uVar11) {
        uVar12 = uVar12 - 1;
        goto LAB_0017d7da;
      }
      if (uVar11 < (uVar9 < 10000)) goto LAB_0017d7da;
      auVar13 = __udivti3(uVar9,uVar11,10000,0);
      uVar6 = uVar12 + 4;
    } while (uVar11 != 0 || -uVar11 < (ulong)(99999 < uVar9));
    uVar12 = uVar12 + 1;
  }
LAB_0017d7da:
  local_98.f.groups = &local_f8;
  pcVar1 = local_f8._M_dataplus._M_p + local_f8._M_string_length;
  _Var10._M_p = local_f8._M_dataplus._M_p;
  uVar6 = uVar12;
  if (local_f8._M_string_length == 0) {
LAB_0017d81d:
    uVar8 = uVar6;
    local_98.f.size = uVar12;
    if (_Var10._M_p == pcVar1) goto LAB_0017d828;
  }
  else {
    local_98.f.size = uVar12 + (int)local_f8._M_string_length;
    do {
      cVar2 = *_Var10._M_p;
      uVar8 = uVar6 - (int)cVar2;
      if ((uVar8 == 0 || (int)uVar6 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_0017d81d;
      uVar12 = uVar12 + 1;
      _Var10._M_p = _Var10._M_p + 1;
      local_f8._M_string_length = local_f8._M_string_length - 1;
      uVar6 = uVar8;
    } while (local_f8._M_string_length != 0);
LAB_0017d828:
    local_98.f.size = (int)(uVar8 - 1) / (int)pcVar1[-1] + local_98.f.size;
  }
  pbVar5 = this->specs;
  local_98.prefix.size_ = (size_t)this->prefix_size;
  local_98.prefix.data_ = this->prefix;
  local_d8.width = pbVar5->width;
  local_d8.precision = pbVar5->precision;
  uStack_b0._0_1_ = pbVar5->type;
  uStack_b0._1_3_ = *(undefined3 *)&pbVar5->field_0x9;
  uStack_b0._4_4_ = (pbVar5->fill).data_[0];
  local_d8.fill.data_._4_8_ = *(undefined8 *)((pbVar5->fill).data_ + 1);
  local_d8.fill._12_8_ = *(undefined8 *)((pbVar5->fill).data_ + 3);
  uVar9 = (uint)local_98.f.size + local_98.prefix.size_;
  local_d8._9_1_ = SUB31(uStack_b0._1_3_,0);
  local_98.fill = uStack_b0._4_4_;
  local_d8._8_8_ = uStack_b0;
  if ((local_d8._9_1_ & 0xf) == 4) {
    uVar11 = local_d8._0_8_ & 0xffffffff;
    local_98.size_ = uVar9;
    local_98.padding = 0;
    if (uVar9 <= uVar11) {
      local_98.size_ = uVar11;
      local_98.padding = uVar11 - uVar9;
    }
  }
  else {
    local_98.padding = 0;
    uVar12 = local_d8.precision - local_98.f.size;
    if (uVar12 != 0 && local_98.f.size <= (int)local_d8.precision) {
      local_98.fill = L'0';
    }
    if (uVar12 != 0 && local_98.f.size <= (int)local_d8.precision) {
      uVar9 = (uint)local_d8.precision + local_98.prefix.size_;
      local_98.padding = (ulong)uVar12;
    }
    local_98.size_ = uVar9;
    if ((uStack_b0 & 0xf00) == 0) {
      local_d8._8_8_ = uStack_b0 | 0x200;
    }
  }
  local_b8 = local_d8._0_8_;
  local_a8._0_8_ = local_d8.fill.data_._4_8_;
  local_a8._8_8_ = local_d8.fill._12_8_;
  local_98.f.abs_value._0_8_ = uVar3;
  local_98.f.abs_value._8_8_ = uVar4;
  local_98.f.sep = wVar7;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::num_writer>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_d8,&local_98);
LAB_0017d8fc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }